

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O2

void __thiscall BufferedFileWriter::~BufferedFileWriter(BufferedFileWriter *this)

{
  WaitableSafeQueue<WriterData> *this_00;
  bool bVar1;
  WriterData writerData;
  WriterData WStack_38;
  
  terminate(this);
  this_00 = &this->m_writeQueue;
  while( true ) {
    bVar1 = SafeQueue<WriterData>::empty((SafeQueue<WriterData> *)this_00);
    if (bVar1) break;
    WaitableSafeQueue<WriterData>::pop(&WStack_38,this_00);
    WriterData::execute(&WStack_38);
  }
  WaitableSafeQueue<WriterData>::~WaitableSafeQueue(this_00);
  std::__cxx11::string::~string((string *)&this->m_lastErrorStr);
  TerminatableThread::~TerminatableThread(&this->super_TerminatableThread);
  return;
}

Assistant:

BufferedFileWriter::~BufferedFileWriter()
{
    terminate();
    while (!m_writeQueue.empty())
    {
        WriterData writerData = m_writeQueue.pop();
        writerData.execute();
    }
}